

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingBuffer.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2057::RingBufferTest_Simple_Test::~RingBufferTest_Simple_Test
          (RingBufferTest_Simple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST( RingBufferTest,  Simple )
	{
		constexpr unsigned TEST_SIZE = 256;
		RingBuffer<uint16_t> rb(TEST_SIZE);
		for( int i=0; i<TEST_SIZE ; ++i )
			EXPECT_EQ( rb.push(i), true );
		EXPECT_EQ( rb.length(), TEST_SIZE);
		EXPECT_EQ( rb.push(0), false );  // buffer overflow. failed to push
		for( int i=0; i<TEST_SIZE ; ++i )
			EXPECT_EQ( rb[i], i );
		for( int i=0; i<TEST_SIZE ; ++i ) {
			auto v = rb.pop(); 
			EXPECT_EQ( v, i);
		}
		EXPECT_TRUE( rb.isEmpty() );
	}